

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::MultiNodeChain<QDomNodePrivate_*>::free
          (MultiNodeChain<QDomNodePrivate_*> *this,void *__ptr)

{
  MultiNodeChain<QDomNodePrivate_*> *pMVar1;
  
  while (this != (MultiNodeChain<QDomNodePrivate_*> *)0x0) {
    pMVar1 = this->next;
    operator_delete(this,0x10);
    this = pMVar1;
  }
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }